

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

Saig_Bmc_t *
Saig_BmcManStart(Aig_Man_t *pAig,int nFramesMax,int nNodesMax,int nConfMaxOne,int nConfMaxAll,
                int fVerbose,int fUseSatoko)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  Saig_Bmc_t *p;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Aig_Man_t *pAVar8;
  satoko_t *s;
  sat_solver *s_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar9;
  size_t __size;
  int Lit;
  satoko_opts_t opts;
  int local_a4;
  int local_a0;
  int local_9c;
  satoko_opts_t local_98;
  
  local_9c = fVerbose;
  p = (Saig_Bmc_t *)malloc(0x88);
  memset(p,0,0x88);
  p->nFramesMax = nFramesMax;
  p->nNodesMax = nNodesMax;
  p->nConfMaxOne = nConfMaxOne;
  p->nConfMaxAll = nConfMaxAll;
  p->fVerbose = local_9c;
  p->pAig = pAig;
  iVar9 = pAig->vObjs->nSize;
  p->nObjs = iVar9;
  local_a0 = nConfMaxOne;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  p->vAig2Frm = pVVar4;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0;
  pVVar6->nSize = 0;
  pVVar6->pArray = (int *)0x0;
  p->vObj2Var = pVVar6;
  if (0 < (long)iVar9) {
    __size = (long)iVar9 << 2;
    piVar7 = (int *)malloc(__size);
    pVVar6->pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar6->nCap = iVar9;
    if (0 < iVar9) {
      memset(pVVar6->pArray,0,__size);
    }
  }
  pVVar6->nSize = iVar9;
  pAVar8 = Aig_ManStart(iVar9);
  p->pFrm = pAVar8;
  if (0 < pAig->nRegs) {
    iVar9 = 0;
    do {
      uVar3 = pAig->nTruePis + iVar9;
      if (((int)uVar3 < 0) || (pAig->vCis->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Saig_BmcObjSetFrame(p,(Aig_Obj_t *)pAig->vCis->pArray[uVar3],0,
                          (Aig_Obj_t *)((ulong)pAVar8->pConst1 ^ 1));
      iVar9 = iVar9 + 1;
    } while (iVar9 < pAig->nRegs);
  }
  p->nSatVars = 1;
  local_a4 = 2;
  if (fUseSatoko == 0) {
    s_00 = sat_solver_new();
    p->pSat = s_00;
    s_00->nLearntDelta = 5000;
    s_00->nLearntRatio = 0x4b;
    s_00->nLearntMax = 10000;
    s_00->nLearntStart = 10000;
    sat_solver_setnvars(s_00,2000);
    sat_solver_addclause(s_00,&local_a4,&local_a0);
    iVar9 = extraout_EDX_00;
  }
  else {
    satoko_default_opts(&local_98);
    local_98.conf_limit = (long)local_a0;
    s = satoko_create();
    p->pSat2 = s;
    satoko_configure(s,&local_98);
    satoko_setnvars(s,2000);
    satoko_add_clause(s,&local_a4,1);
    iVar9 = extraout_EDX;
  }
  pAVar2 = pAVar8->pConst1;
  p->nSatVars = 2;
  iVar1 = pAVar2->Id;
  Vec_IntFillExtra(pVVar6,iVar1 + 1,iVar9);
  if ((-1 < (long)iVar1) && (iVar1 < pVVar6->nSize)) {
    pVVar6->pArray[iVar1] = 1;
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    pVVar4->nCap = 1000;
    pVVar4->nSize = 0;
    ppvVar5 = (void **)malloc(8000);
    pVVar4->pArray = ppvVar5;
    p->vTargets = pVVar4;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 1000;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(4000);
    pVVar6->pArray = piVar7;
    p->vVisited = pVVar6;
    p->iFrameFail = -1;
    p->iOutputFail = -1;
    return p;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Saig_Bmc_t * Saig_BmcManStart( Aig_Man_t * pAig, int nFramesMax, int nNodesMax, int nConfMaxOne, int nConfMaxAll, int fVerbose, int fUseSatoko )
{
    Saig_Bmc_t * p;
    Aig_Obj_t * pObj;
    int i, Lit;
//    assert( Aig_ManRegNum(pAig) > 0 );
    p = (Saig_Bmc_t *)ABC_ALLOC( char, sizeof(Saig_Bmc_t) );
    memset( p, 0, sizeof(Saig_Bmc_t) );
    // set parameters
    p->nFramesMax   = nFramesMax;
    p->nNodesMax    = nNodesMax;
    p->nConfMaxOne  = nConfMaxOne;
    p->nConfMaxAll  = nConfMaxAll;
    p->fVerbose     = fVerbose;
    p->pAig         = pAig;
    p->nObjs        = Aig_ManObjNumMax(pAig);
    // create node and variable mappings
    p->vAig2Frm     = Vec_PtrAlloc( 100 );
    p->vObj2Var     = Vec_IntAlloc( 0 );
    Vec_IntFill( p->vObj2Var, p->nObjs, 0 );
    // start the AIG manager and map primary inputs
    p->pFrm         = Aig_ManStart( p->nObjs );
    Saig_ManForEachLo( pAig, pObj, i )
        Saig_BmcObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrm) ); 
    // create SAT solver
    p->nSatVars     = 1;
    Lit = toLit( p->nSatVars );
    if ( fUseSatoko )
    {
        satoko_opts_t opts;
        satoko_default_opts(&opts);
        opts.conf_limit = nConfMaxOne;
        p->pSat2 = satoko_create();  
        satoko_configure(p->pSat2, &opts);
        satoko_setnvars(p->pSat2, 2000);
        satoko_add_clause( p->pSat2, &Lit, 1 );
    }
    else
    {
        p->pSat = sat_solver_new();
        p->pSat->nLearntStart = 10000;//p->pPars->nLearnedStart;
        p->pSat->nLearntDelta =  5000;//p->pPars->nLearnedDelta;
        p->pSat->nLearntRatio =    75;//p->pPars->nLearnedPerce;
        p->pSat->nLearntMax   = p->pSat->nLearntStart;
        sat_solver_setnvars( p->pSat, 2000 );
        sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    }
    Saig_BmcSetSatNum( p, Aig_ManConst1(p->pFrm), p->nSatVars++ );
    // other data structures
    p->vTargets     = Vec_PtrAlloc( 1000 );
    p->vVisited     = Vec_IntAlloc( 1000 );
    p->iOutputFail  = -1;
    p->iFrameFail   = -1;
    return p;
}